

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O3

void __thiscall Am_Connection::Send(Am_Connection *this,Am_Value *value)

{
  ushort uVar1;
  Am_Connection_Data *pAVar2;
  Am_Map_Types *pAVar3;
  Am_Marshall_Method AVar4;
  unsigned_long net_type;
  key_type local_38;
  ulong local_28;
  
  pAVar2 = this->data;
  while ((pAVar2 != (Am_Connection_Data *)0x0 && (pAVar2->connected == false))) {
    Wait_For_Connect();
    pAVar2 = this->data;
  }
  local_38.value.long_value._2_6_ = 0;
  local_38.value.long_value._0_2_ = value->type;
  local_38.type = 2;
  pAVar3 = (Am_Map_Types *)
           std::
           _Rb_tree<Am_Value,_std::pair<const_Am_Value,_unsigned_short>,_std::_Select1st<std::pair<const_Am_Value,_unsigned_short>_>,_std::less<Am_Value>,_std::allocator<std::pair<const_Am_Value,_unsigned_short>_>_>
           ::find((_Rb_tree<Am_Value,_std::pair<const_Am_Value,_unsigned_short>,_std::_Select1st<std::pair<const_Am_Value,_unsigned_short>_>,_std::less<Am_Value>,_std::allocator<std::pair<const_Am_Value,_unsigned_short>_>_>
                   *)&Types,&local_38);
  if (pAVar3 == (Am_Map_Types *)&Types.mMap._M_t._M_impl.super__Rb_tree_header) {
    pAVar3 = &Types;
  }
  uVar1 = pAVar3->mDefaultReturn;
  Am_Value::~Am_Value(&local_38);
  if (uVar1 != 0) {
    local_28 = (ulong)((uVar1 & 0xff00) << 8 | (uint)uVar1 << 0x18);
    send(*(int *)&(this->data->super_Am_Wrapper).field_0xc,&local_28,8,0);
    local_38.type = uVar1;
    AVar4 = OpenAmulet::Map<unsigned_short,_Am_Marshall_Method,_std::less<unsigned_short>_>::GetAt
                      (&Marshall_Methods,&local_38.type);
    (*AVar4.Call)(*(int *)&(this->data->super_Am_Wrapper).field_0xc,value,this);
    return;
  }
  Am_Error("Send:Tried to send unknown type!");
}

Assistant:

void
Am_Connection::Send(Am_Value value)
{
  while ((data != nullptr) && (!(data->connected))) {
    Am_Connection::Wait_For_Connect();
  }
  Am_Marshall_Method Marshaller;
  unsigned long type, net_type;

  type = Am_Connection::Types.GetAt(value.type);
  if (type == Am_NONE)
    Am_Error("Send:Tried to send unknown type!");
  else {
    net_type = htonl(type);
    send(data->m_socket, &net_type, sizeof(net_type), 0);
    Marshaller = (Am_Connection::Marshall_Methods.GetAt(type));
    Marshaller.Call(data->m_socket, value, this);
  }
}